

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall
QAbstractItemViewPrivate::checkMouseMove
          (QAbstractItemViewPrivate *this,QPersistentModelIndex *index)

{
  QObject *pQVar1;
  QAbstractItemModel *pQVar2;
  char cVar3;
  long in_FS_OFFSET;
  QStatusTipEvent tip;
  QModelIndex local_a0;
  anon_union_24_3_e3d07ef4_for_data local_88;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QArrayData *local_58;
  anon_union_24_3_e3d07ef4_for_data *paStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)
            &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
             field_0x8;
  setHoverIndex(this,index);
  if (this->viewportEnteredNeeded == false) {
    cVar3 = comparesEqual(&this->enteredIndex,index);
    if (cVar3 != '\0') goto LAB_0053933c;
  }
  this->viewportEnteredNeeded = false;
  cVar3 = QPersistentModelIndex::isValid();
  if (cVar3 == '\0') {
    if ((*(long *)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate
                   .field_0x10 != 0) && (this->shouldClearStatusTip == true)) {
      local_58 = (QArrayData *)0x0;
      paStack_50 = (anon_union_24_3_e3d07ef4_for_data *)0x0;
      local_48 = (undefined1 *)0x0;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_88.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStatusTipEvent::QStatusTipEvent((QStatusTipEvent *)local_88.data,(QString *)&local_58);
      QCoreApplication::sendEvent
                (*(QObject **)
                  &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate
                   .field_0x10,(QEvent *)local_88.data);
      QStatusTipEvent::~QStatusTipEvent((QStatusTipEvent *)local_88.data);
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58,2,0x10);
        }
      }
    }
    QMetaObject::activate(pQVar1,&QAbstractItemView::staticMetaObject,5,(void **)0x0);
  }
  else {
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_88,index);
    local_58 = (QArrayData *)0x0;
    paStack_50 = &local_88;
    QMetaObject::activate(pQVar1,&QAbstractItemView::staticMetaObject,4,&local_58);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    paStack_50 = (anon_union_24_3_e3d07ef4_for_data *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = this->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_a0,index);
    (**(code **)(*(long *)pQVar2 + 0x90))(&local_88,pQVar2,&local_a0,4);
    ::QVariant::toString();
    ::QVariant::~QVariant((QVariant *)&local_88);
    if ((*(long *)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate
                   .field_0x10 != 0) &&
       ((this->shouldClearStatusTip != false || (local_48 != (undefined1 *)0x0)))) {
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_88.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStatusTipEvent::QStatusTipEvent((QStatusTipEvent *)local_88.data,(QString *)&local_58);
      QCoreApplication::sendEvent
                (*(QObject **)
                  &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate
                   .field_0x10,(QEvent *)local_88.data);
      this->shouldClearStatusTip = local_48 != (undefined1 *)0x0;
      QStatusTipEvent::~QStatusTipEvent((QStatusTipEvent *)local_88.data);
    }
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,0x10);
      }
    }
  }
  QPersistentModelIndex::operator=(&this->enteredIndex,index);
LAB_0053933c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::checkMouseMove(const QPersistentModelIndex &index)
{
    //we take a persistent model index because the model might change by emitting signals
    Q_Q(QAbstractItemView);
    setHoverIndex(index);
    if (viewportEnteredNeeded || enteredIndex != index) {
        viewportEnteredNeeded = false;

        if (index.isValid()) {
            emit q->entered(index);
#if QT_CONFIG(statustip)
            QString statustip = model->data(index, Qt::StatusTipRole).toString();
            if (parent && (shouldClearStatusTip || !statustip.isEmpty())) {
                QStatusTipEvent tip(statustip);
                QCoreApplication::sendEvent(parent, &tip);
                shouldClearStatusTip = !statustip.isEmpty();
            }
#endif
        } else {
#if QT_CONFIG(statustip)
            if (parent && shouldClearStatusTip) {
                QString emptyString;
                QStatusTipEvent tip( emptyString );
                QCoreApplication::sendEvent(parent, &tip);
            }
#endif
            emit q->viewportEntered();
        }
        enteredIndex = index;
    }
}